

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_printf.cpp
# Opt level: O0

ostream * ostream_printf(ostream *stream,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  pair<char_*,_long> local_60;
  int local_4c;
  undefined4 local_48;
  int actual_size;
  va_list vl;
  undefined1 local_28 [8];
  pair<char_*,_long> buffer;
  char *fmt_local;
  ostream *stream_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  buffer.second = (long)fmt;
  _local_28 = std::get_temporary_buffer<char>(0x80);
  if (0 < (long)buffer.first) {
    vl[0].overflow_arg_area = local_118;
    vl[0]._0_8_ = &stack0x00000008;
    actual_size = 0x30;
    local_48 = 0x10;
    local_4c = vsnprintf((char *)local_28,(size_t)buffer.first,(char *)buffer.second,&local_48);
    if ((long)local_4c < (long)buffer.first) {
      std::operator<<(stream,(char *)local_28);
      std::return_temporary_buffer<char>((char *)local_28);
    }
    else {
      std::return_temporary_buffer<char>((char *)local_28);
      local_60 = std::get_temporary_buffer<char>((long)(local_4c + 1));
      std::pair<char_*,_long>::operator=((pair<char_*,_long> *)local_28,&local_60);
      if (0 < (long)buffer.first) {
        vl[0].overflow_arg_area = local_118;
        vl[0]._0_8_ = &stack0x00000008;
        actual_size = 0x30;
        local_48 = 0x10;
        vsnprintf((char *)local_28,(size_t)buffer.first,(char *)buffer.second,&local_48);
        std::operator<<(stream,(char *)local_28);
        std::return_temporary_buffer<char>((char *)local_28);
      }
    }
  }
  return stream;
}

Assistant:

std::ostream& ostream_printf(std::ostream& stream, const char* fmt, ...) {
	auto buffer = std::get_temporary_buffer<char>(DEFAULT_SIZE);
	if (buffer.second > 0) {
		va_list vl;
		va_start(vl, fmt);
		auto actual_size = vsnprintf(buffer.first, buffer.second, fmt, vl);
		if (buffer.second <= actual_size) {
			std::return_temporary_buffer(buffer.first);
			buffer = std::get_temporary_buffer<char>(actual_size + 1);
			if (buffer.second > 0) {
				va_start(vl, fmt);
				vsnprintf(buffer.first, buffer.second, fmt, vl);
				stream << buffer.first;
				std::return_temporary_buffer(buffer.first);
			}
		}
		else {
			stream << buffer.first;
			std::return_temporary_buffer(buffer.first);
		}
	}
	return stream;
}